

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_MulVector(double (*m) [3],double *v,double *product)

{
  double temp [3];
  int j;
  int i;
  double *product_local;
  double *v_local;
  double (*m_local) [3];
  
  for (i = 0; i < 3; i = i + 1) {
    temp[i] = 0.0;
    for (j = 0; j < 3; j = j + 1) {
      temp[i] = m[i][j] * v[j] + temp[i];
    }
  }
  *product = temp[0];
  product[1] = temp[1];
  product[2] = temp[2];
  return;
}

Assistant:

void M3x3_MulVector(const double m[3][3], const double v[3], double product[3])
{
    int i, j;
    double temp[3];

    for (i=0 ; i<3 ; i++)
    {
        temp[i] = 0.0;

        for (j=0 ; j<3 ; j++)
        {
            temp[i] += m[i][j] * v[j];
        }
    }
    memcpy(product, temp, 3*sizeof(double));
}